

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_read_pt_bitlen(lzh_stream *strm,wchar_t start,wchar_t end)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  lzh_dec *plVar3;
  bool bVar4;
  wchar_t wVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = (ulong)(uint)start;
  if (start < end) {
    plVar3 = strm->ds;
    uVar10 = (ulong)start;
    do {
      if ((((plVar3->br).cache_avail < L'\x03') &&
          (wVar5 = lzh_br_fillup(strm,&plVar3->br), wVar5 == L'\0')) &&
         ((plVar3->br).cache_avail < L'\x03')) {
        return (wchar_t)uVar10;
      }
      wVar2 = (plVar3->br).cache_avail;
      wVar5 = wVar2 + L'\xfffffffd';
      uVar6 = (uint)((plVar3->br).cache_buffer >> ((byte)wVar5 & 0x3f)) & 7;
      if (uVar6 == 7) {
        if (((wVar2 < L'\r') && (wVar5 = lzh_br_fillup(strm,&plVar3->br), wVar5 == L'\0')) &&
           ((plVar3->br).cache_avail < L'\r')) {
          bVar4 = false;
          uVar6 = 7;
          uVar7 = uVar10 & 0xffffffff;
        }
        else {
          wVar5 = (plVar3->br).cache_avail;
          uVar9 = (plVar3->br).cache_buffer >> ((char)wVar5 - 0xdU & 0x3f);
          uVar6 = 7;
          if (((uint)uVar9 >> 9 & 1) != 0) {
            uVar6 = 7;
            do {
              uVar6 = uVar6 + 1;
              uVar8 = (uint)uVar9;
              uVar9 = (ulong)(uVar8 * 2);
            } while ((uVar8 >> 8 & 1) != 0);
          }
          if (uVar6 < 0x11) {
            (plVar3->br).cache_avail = (wVar5 - uVar6) + L'\x03';
            bVar4 = true;
          }
          else {
            uVar7 = 0xffffffff;
            bVar4 = false;
          }
        }
        if (!bVar4) {
          return (wchar_t)uVar7;
        }
      }
      else {
        (plVar3->br).cache_avail = wVar5;
      }
      (plVar3->pt).bitlen[uVar10] = (uchar)uVar6;
      uVar10 = uVar10 + 1;
      pwVar1 = (plVar3->pt).freq + (int)uVar6;
      *pwVar1 = *pwVar1 + L'\x01';
      start = end;
    } while ((wchar_t)uVar10 != end);
  }
  return start;
}

Assistant:

static int
lzh_read_pt_bitlen(struct lzh_stream *strm, int start, int end)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br * br = &(ds->br);
	int c, i;

	for (i = start; i < end;) {
		/*
		 *  bit pattern     the number we need
		 *     000           ->  0
		 *     001           ->  1
		 *     010           ->  2
		 *     ...
		 *     110           ->  6
		 *     1110          ->  7
		 *     11110         ->  8
		 *     ...
		 *     1111111111110 ->  16
		 */
		if (!lzh_br_read_ahead(strm, br, 3))
			return (i);
		if ((c = lzh_br_bits(br, 3)) == 7) {
			int d;
			if (!lzh_br_read_ahead(strm, br, 13))
				return (i);
			d = lzh_br_bits(br, 13);
			while (d & 0x200) {
				c++;
				d <<= 1;
			}
			if (c > 16)
				return (-1);/* Invalid data. */
			lzh_br_consume(br, c - 3);
		} else
			lzh_br_consume(br, 3);
		ds->pt.bitlen[i++] = c;
		ds->pt.freq[c]++;
	}
	return (i);
}